

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFileAndLineForTestAndFailure(TestOutput *this,TestFailure *failure)

{
  long *in_RSI;
  TestOutput *in_RDI;
  SimpleString *testName;
  undefined1 local_50 [16];
  SimpleString local_40;
  size_t in_stack_ffffffffffffffd0;
  SimpleString *in_stack_ffffffffffffffd8;
  TestOutput *in_stack_ffffffffffffffe0;
  
  (**(code **)(*in_RSI + 0x38))(&stack0xffffffffffffffe0);
  (**(code **)(*in_RSI + 0x40))();
  printErrorInFileOnLineFormattedForWorkingEnvironment
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)0x17d200);
  testName = &local_40;
  (**(code **)(*in_RSI + 0x18))();
  printFailureInTest(in_RDI,testName);
  SimpleString::~SimpleString((SimpleString *)0x17d233);
  (**(code **)(*in_RSI + 0x10))(local_50);
  (**(code **)(*in_RSI + 0x28))();
  printErrorInFileOnLineFormattedForWorkingEnvironment
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)0x17d27b);
  return;
}

Assistant:

void TestOutput::printFileAndLineForTestAndFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getTestFileName(), failure.getTestLineNumber());
    printFailureInTest(failure.getTestName());
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
}